

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O3

int PHYSFS_deregisterArchiver(char *ext)

{
  int iVar1;
  char *in_RAX;
  PHYSFS_ErrorCode errcode;
  size_t idx;
  
  if (initialized == '\0') {
    errcode = PHYSFS_ERR_NOT_INITIALIZED;
  }
  else if (ext == (char *)0x0) {
    errcode = PHYSFS_ERR_INVALID_ARGUMENT;
  }
  else {
    __PHYSFS_platformGrabMutex(stateLock);
    if (numArchivers != 0) {
      idx = 0;
      do {
        iVar1 = PHYSFS_utf8stricmp(in_RAX,(char *)0x1072d3);
        if (iVar1 == 0) {
          iVar1 = doDeregisterArchiver(idx);
          __PHYSFS_platformReleaseMutex(stateLock);
          return iVar1;
        }
        idx = idx + 1;
      } while (idx < numArchivers);
    }
    __PHYSFS_platformReleaseMutex(stateLock);
    errcode = PHYSFS_ERR_NOT_FOUND;
  }
  PHYSFS_setErrorCode(errcode);
  return 0;
}

Assistant:

int PHYSFS_deregisterArchiver(const char *ext)
{
    size_t i;

    BAIL_IF(!initialized, PHYSFS_ERR_NOT_INITIALIZED, 0);
    BAIL_IF(!ext, PHYSFS_ERR_INVALID_ARGUMENT, 0);

    __PHYSFS_platformGrabMutex(stateLock);
    for (i = 0; i < numArchivers; i++)
    {
        if (PHYSFS_utf8stricmp(archiveInfo[i]->extension, ext) == 0)
        {
            const int retval = doDeregisterArchiver(i);
            __PHYSFS_platformReleaseMutex(stateLock);
            return retval;
        } /* if */
    } /* for */
    __PHYSFS_platformReleaseMutex(stateLock);

    BAIL(PHYSFS_ERR_NOT_FOUND, 0);
}